

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::getDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Value *value)

{
  string *__lhs;
  BaseType BVar1;
  EnumDef *pEVar2;
  bool bVar3;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  if ((value->constant)._M_string_length != 0) {
    __lhs = &value->constant;
    bVar3 = std::operator!=(__lhs,"0");
    if (bVar3) {
      BVar1 = (value->type).base_type;
      if (BVar1 == BASE_TYPE_BOOL) {
        __s = "true";
        __a = &local_19;
      }
      else {
        if (0xb < BVar1 - BASE_TYPE_UTYPE) {
LAB_00189490:
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
          return __return_storage_ptr__;
        }
        bVar3 = StringIsFlatbufferNan(__lhs);
        if (bVar3) {
          __s = "double.nan";
          __a = &local_1a;
        }
        else {
          bVar3 = StringIsFlatbufferPositiveInfinity(__lhs);
          if (bVar3) {
            __s = "double.infinity";
            __a = &local_1b;
          }
          else {
            bVar3 = StringIsFlatbufferNegativeInfinity(__lhs);
            if (!bVar3) goto LAB_00189490;
            __s = "double.negativeInfinity";
            __a = &local_1c;
          }
        }
      }
      goto LAB_00189447;
    }
  }
  BVar1 = (value->type).base_type;
  if (BVar1 == BASE_TYPE_BOOL) {
    __s = "false";
    __a = &local_1d;
  }
  else if ((BVar1 - BASE_TYPE_UTYPE < 0xc) &&
          ((pEVar2 = (value->type).enum_def, pEVar2 == (EnumDef *)0x0 || (pEVar2->is_union == false)
           ))) {
    __s = "0";
    __a = &local_1e;
  }
  else {
    __s = "";
    __a = &local_1f;
  }
LAB_00189447:
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultValue(const Value &value) const {
    if (!value.constant.empty() && value.constant != "0") {
      if (IsBool(value.type.base_type)) { return "true"; }
      if (IsScalar(value.type.base_type)) {
        if (StringIsFlatbufferNan(value.constant)) {
          return "double.nan";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "double.infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "double.negativeInfinity";
        }
      }
      return value.constant;
    } else if (IsBool(value.type.base_type)) {
      return "false";
    } else if (IsScalar(value.type.base_type) && !IsUnion(value.type)) {
      return "0";
    } else {
      return "";
    }
  }